

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void learn_bandit_adf(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  multi_ex *ec_00;
  ulong uVar1;
  uint32_t i;
  size_t a;
  ulong uVar2;
  float fVar3;
  vector<float,_std::allocator<float>_> old_weights;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  copy_example_to_adf(data,ec);
  ec_00 = &data->ecs;
  v_array<CB::cb_class>::push_back
            ((v_array<CB::cb_class> *)
             &((data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start[(data->cl_adf).action - 1]->l).simple,&data->cl_adf)
  ;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0; uVar2 < data->num_actions; uVar2 = uVar2 + 1) {
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&local_48,
               &(ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar2]->weight);
  }
  for (uVar2 = 0; uVar2 < data->choices_lambda; uVar2 = uVar2 + 1) {
    fVar3 = compute_weight_multiplier(data,uVar2,ec_type);
    for (uVar1 = 0; uVar1 < data->num_actions; uVar1 = uVar1 + 1) {
      (ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar1]->weight =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar1] * fVar3;
    }
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              (base,ec_00,uVar2);
  }
  for (uVar2 = 0; uVar2 < data->num_actions; uVar2 = uVar2 + 1) {
    (ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar2]->weight =
         local_48._M_impl.super__Vector_impl_data._M_start[uVar2];
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);

  // add cb label to chosen action
	auto& cl = data.cl_adf;
  auto& lab = data.ecs[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
	  for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
	  base.learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];
}